

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O1

vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
* __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_4UL>_>::
export_filter<boost::asio::ip::address_v4>
          (vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
           *__return_storage_ptr__,filter_impl<std::array<unsigned_char,_4UL>_> *this)

{
  char *pcVar1;
  char cVar2;
  address_v4 aVar3;
  _Base_ptr p_Var4;
  long lVar5;
  _Rb_tree_header *p_Var6;
  in4_addr_type local_30;
  value_type local_2c;
  
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
  ::reserve(__return_storage_ptr__,
            (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  p_Var4 = (this->m_access_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(this->m_access_list)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var6) {
    do {
      local_2c.last.addr_.s_addr = (in4_addr_type)0x0;
      local_2c.first.addr_.s_addr = (in4_addr_type)(in4_addr_type)p_Var4[1]._M_color;
      local_2c.flags = *(uint32_t *)&p_Var4[1].field_0x4;
      p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4);
      if ((_Rb_tree_header *)p_Var4 == p_Var6) {
        aVar3.addr_.s_addr = (in4_addr_type)(in4_addr_type)~_S_red;
      }
      else {
        local_30.s_addr = p_Var4[1]._M_color;
        lVar5 = 3;
        do {
          aVar3.addr_.s_addr = (in4_addr_type)(in4_addr_type)local_30.s_addr;
          if (lVar5 == -1) break;
          pcVar1 = (char *)((long)&local_30.s_addr + lVar5);
          cVar2 = *pcVar1;
          *pcVar1 = *pcVar1 + -1;
          lVar5 = lVar5 + -1;
          aVar3.addr_.s_addr = (in4_addr_type)(in4_addr_type)local_30.s_addr;
        } while (cVar2 == '\0');
      }
      local_2c.last.addr_.s_addr = aVar3.addr_.s_addr;
      ::std::
      vector<libtorrent::ip_range<boost::asio::ip::address_v4>,_std::allocator<libtorrent::ip_range<boost::asio::ip::address_v4>_>_>
      ::push_back(__return_storage_ptr__,&local_2c);
    } while ((_Rb_tree_header *)p_Var4 != p_Var6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ip_range<ExternalAddressType>> filter_impl<Addr>::export_filter() const
	{
		std::vector<ip_range<ExternalAddressType>> ret;
		ret.reserve(m_access_list.size());

		for (auto i = m_access_list.begin()
			, end(m_access_list.end()); i != end;)
		{
			ip_range<ExternalAddressType> r;
			r.first = ExternalAddressType(i->start);
			r.flags = i->access;

			++i;
			if (i == end)
				r.last = ExternalAddressType(max_addr<Addr>());
			else
				r.last = ExternalAddressType(minus_one(i->start));

			ret.push_back(r);
		}
		return ret;
	}